

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O1

int libssh2_channel_eof(LIBSSH2_CHANNEL *channel)

{
  uint uVar1;
  uint uVar2;
  list_node *node;
  
  if (channel == (LIBSSH2_CHANNEL *)0x0) {
    return -0x27;
  }
  node = (list_node *)_libssh2_list_first(&channel->session->packets);
  while( true ) {
    if (node == (list_node *)0x0) {
      return (int)(channel->remote).eof;
    }
    if ((((ulong)(node[1].next)->next & 0xfe) == 0x5e) &&
       (uVar1 = (channel->local).id,
       uVar2 = _libssh2_ntohu32((uchar *)((long)&(node[1].next)->next + 1)), uVar1 == uVar2)) break;
    node = (list_node *)_libssh2_list_next(node);
  }
  return 0;
}

Assistant:

LIBSSH2_API int
libssh2_channel_eof(LIBSSH2_CHANNEL * channel)
{
    LIBSSH2_SESSION *session;
    LIBSSH2_PACKET *packet;

    if(!channel)
        return LIBSSH2_ERROR_BAD_USE;

    session = channel->session;
    packet = _libssh2_list_first(&session->packets);

    while (packet) {
        if (((packet->data[0] == SSH_MSG_CHANNEL_DATA)
             || (packet->data[0] == SSH_MSG_CHANNEL_EXTENDED_DATA))
            && (channel->local.id == _libssh2_ntohu32(packet->data + 1))) {
            /* There's data waiting to be read yet, mask the EOF status */
            return 0;
        }
        packet = _libssh2_list_next(&packet->node);
    }

    return channel->remote.eof;
}